

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkheader.c
# Opt level: O0

ktx_error_code_e ktxCheckHeader1_(KTX_header *pHeader,KTX_supplemental_info *pSuppInfo)

{
  int iVar1;
  undefined1 *in_RSI;
  void *in_RDI;
  ktx_uint32_t max_dim;
  ktx_uint8_t identifier_reference [12];
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined8 local_24;
  undefined4 local_1c;
  undefined1 *local_18;
  void *local_10;
  ktx_error_code_e local_4;
  
  local_24 = 0xbb31312058544bab;
  local_1c = 0xa1a0a0d;
  if ((in_RDI == (void *)0x0) || (in_RSI == (undefined1 *)0x0)) {
    __assert_fail("pHeader != NULL && pSuppInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/checkheader.c"
                  ,0x3a,"ktx_error_code_e ktxCheckHeader1_(KTX_header *, KTX_supplemental_info *)");
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = memcmp(in_RDI,&local_24,0xc);
  if (iVar1 == 0) {
    if (*(int *)((long)local_10 + 0xc) == 0x1020304) {
      _ktxSwapEndian32((khronos_uint32_t *)((long)local_10 + 0x10),0xc);
      if (((*(int *)((long)local_10 + 0x14) != 1) && (*(int *)((long)local_10 + 0x14) != 2)) &&
         (*(int *)((long)local_10 + 0x14) != 4)) {
        return KTX_FILE_DATA_ERROR;
      }
    }
    else if (*(int *)((long)local_10 + 0xc) != 0x4030201) {
      return KTX_FILE_DATA_ERROR;
    }
    *local_18 = 0;
    if ((*(int *)((long)local_10 + 0x10) == 0) || (*(int *)((long)local_10 + 0x18) == 0)) {
      if (*(int *)((long)local_10 + 0x10) + *(int *)((long)local_10 + 0x18) != 0) {
        return KTX_FILE_DATA_ERROR;
      }
      *local_18 = 1;
    }
    if (*(int *)((long)local_10 + 0x18) == *(int *)((long)local_10 + 0x1c)) {
      local_4 = KTX_FILE_DATA_ERROR;
    }
    else if ((*(int *)((long)local_10 + 0x24) == 0) ||
            ((*(int *)((long)local_10 + 0x2c) != 0 && (*(int *)((long)local_10 + 0x28) == 0)))) {
      local_4 = KTX_FILE_DATA_ERROR;
    }
    else {
      if (*(int *)((long)local_10 + 0x2c) == 0) {
        if (*(int *)((long)local_10 + 0x28) == 0) {
          *(undefined2 *)(local_18 + 2) = 1;
        }
        else {
          *(undefined2 *)(local_18 + 2) = 2;
        }
      }
      else {
        if (*(int *)((long)local_10 + 0x30) != 0) {
          return KTX_UNSUPPORTED_FEATURE;
        }
        *(undefined2 *)(local_18 + 2) = 3;
      }
      if (*(int *)((long)local_10 + 0x34) == 6) {
        if (*(short *)(local_18 + 2) != 2) {
          return KTX_FILE_DATA_ERROR;
        }
      }
      else if (*(int *)((long)local_10 + 0x34) != 1) {
        return KTX_FILE_DATA_ERROR;
      }
      if (*(int *)((long)local_10 + 0x38) == 0) {
        local_18[1] = 1;
        *(undefined4 *)((long)local_10 + 0x38) = 1;
      }
      else {
        local_18[1] = 0;
      }
      if (*(uint *)((long)local_10 + 0x28) < *(uint *)((long)local_10 + 0x24)) {
        local_2c = *(uint *)((long)local_10 + 0x24);
      }
      else {
        local_2c = *(uint *)((long)local_10 + 0x28);
      }
      if (*(uint *)((long)local_10 + 0x2c) < local_2c) {
        if (*(uint *)((long)local_10 + 0x28) < *(uint *)((long)local_10 + 0x24)) {
          local_30 = *(uint *)((long)local_10 + 0x24);
        }
        else {
          local_30 = *(uint *)((long)local_10 + 0x28);
        }
        local_34 = local_30;
      }
      else {
        local_34 = *(uint *)((long)local_10 + 0x2c);
      }
      if (local_34 < (uint)(1 << ((char)*(undefined4 *)((long)local_10 + 0x38) - 1U & 0x1f))) {
        local_4 = KTX_FILE_DATA_ERROR;
      }
      else {
        local_4 = KTX_SUCCESS;
      }
    }
  }
  else {
    local_4 = KTX_UNKNOWN_FILE_FORMAT;
  }
  return local_4;
}

Assistant:

KTX_error_code  ktxCheckHeader1_(KTX_header* pHeader,
                                 KTX_supplemental_info* pSuppInfo)
{
    ktx_uint8_t identifier_reference[12] = KTX_IDENTIFIER_REF;
    ktx_uint32_t max_dim;

    assert(pHeader != NULL && pSuppInfo != NULL);

    /* Compare identifier, is this a KTX file? */
    if (memcmp(pHeader->identifier, identifier_reference, 12) != 0)
    {
        return KTX_UNKNOWN_FILE_FORMAT;
    }

    if (pHeader->endianness == KTX_ENDIAN_REF_REV)
    {
        /* Convert endianness of pHeader fields. */
        _ktxSwapEndian32(&pHeader->glType, 12);

        if (pHeader->glTypeSize != 1 &&
            pHeader->glTypeSize != 2 &&
            pHeader->glTypeSize != 4)
        {
            /* Only 8-, 16-, and 32-bit types supported so far. */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->endianness != KTX_ENDIAN_REF)
    {
        return KTX_FILE_DATA_ERROR;
    }

    /* Check glType and glFormat */
    pSuppInfo->compressed = 0;
    if (pHeader->glType == 0 || pHeader->glFormat == 0)
    {
        if (pHeader->glType + pHeader->glFormat != 0)
        {
            /* either both or none of glType, glFormat must be zero */
            return KTX_FILE_DATA_ERROR;
        }
        pSuppInfo->compressed = 1;
    }

    if (pHeader->glFormat == pHeader->glInternalformat) {
        // glInternalFormat is either unsized (which is no longer and should
        // never have been supported by libktx) or glFormat is sized.
        return KTX_FILE_DATA_ERROR;
    }

    /* Check texture dimensions. KTX files can store 8 types of textures:
       1D, 2D, 3D, cube, and array variants of these. There is currently
       no GL extension for 3D array textures. */
    if ((pHeader->pixelWidth == 0) ||
        (pHeader->pixelDepth > 0 && pHeader->pixelHeight == 0))
    {
        /* texture must have width */
        /* texture must have height if it has depth */
        return KTX_FILE_DATA_ERROR;
    }


    if (pHeader->pixelDepth > 0)
    {
        if (pHeader->numberOfArrayElements > 0)
        {
            /* No 3D array textures yet. */
            return KTX_UNSUPPORTED_FEATURE;
        }
        pSuppInfo->textureDimension = 3;
    }
    else if (pHeader->pixelHeight > 0)
    {
        pSuppInfo->textureDimension = 2;
    }
    else
    {
        pSuppInfo->textureDimension = 1;
    }

    if (pHeader->numberOfFaces == 6)
    {
        if (pSuppInfo->textureDimension != 2)
        {
            /* cube map needs 2D faces */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->numberOfFaces != 1)
    {
        /* numberOfFaces must be either 1 or 6 */
        return KTX_FILE_DATA_ERROR;
    }

    /* Check number of mipmap levels */
    if (pHeader->numberOfMipLevels == 0)
    {
        pSuppInfo->generateMipmaps = 1;
        pHeader->numberOfMipLevels = 1;
    }
    else
    {
        pSuppInfo->generateMipmaps = 0;
    }

    /* This test works for arrays too because height or depth will be 0. */
    max_dim = MAX(MAX(pHeader->pixelWidth, pHeader->pixelHeight), pHeader->pixelDepth);
    if (max_dim < ((ktx_uint32_t)1 << (pHeader->numberOfMipLevels - 1)))
    {
        /* Can't have more mip levels than 1 + log2(max(width, height, depth)) */
        return KTX_FILE_DATA_ERROR;
    }

    return KTX_SUCCESS;
}